

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFindDegenerates.cpp
# Opt level: O2

void __thiscall
FindDegeneratesProcessTest_testDegeneratesDetection_Test::
~FindDegeneratesProcessTest_testDegeneratesDetection_Test
          (FindDegeneratesProcessTest_testDegeneratesDetection_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(FindDegeneratesProcessTest, testDegeneratesDetection) {
    mProcess->EnableInstantRemoval(false);
    mProcess->ExecuteOnMesh(mMesh);

    unsigned int out = 0;
    for (unsigned int i = 0; i < 1000; ++i) {
        aiFace& f = mMesh->mFaces[i];
        out += f.mNumIndices;
    }

    EXPECT_EQ(1000U, mMesh->mNumFaces);
    EXPECT_EQ(10000U, mMesh->mNumVertices);
    EXPECT_EQ(out, mMesh->mNumUVComponents[0]);
    EXPECT_EQ(static_cast<unsigned int>(
                  aiPrimitiveType_LINE | aiPrimitiveType_POINT |
                  aiPrimitiveType_POLYGON | aiPrimitiveType_TRIANGLE),
              mMesh->mPrimitiveTypes);
}